

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioRead.c
# Opt level: O0

char * Mio_LibraryCleanStr(char *p)

{
  char *pcVar1;
  bool bVar2;
  char *pRes;
  int local_18;
  int whitespace_state;
  int k;
  int i;
  char *p_local;
  
  pRes._4_4_ = 0;
  pcVar1 = Abc_UtilStrsav(p);
  local_18 = 0;
  for (whitespace_state = 0; pcVar1[whitespace_state] != '\0';
      whitespace_state = whitespace_state + 1) {
    if ((((pcVar1[whitespace_state] == ' ') || (pcVar1[whitespace_state] == '\t')) ||
        (pcVar1[whitespace_state] == '\r')) || (pcVar1[whitespace_state] == '\n')) {
      bVar2 = pRes._4_4_ != 0;
      pRes._4_4_ = 0;
      if (bVar2) {
        pRes._4_4_ = 2;
      }
    }
    else {
      if (((((pcVar1[whitespace_state] == '(') || (pcVar1[whitespace_state] == ')')) ||
           ((pcVar1[whitespace_state] == '+' ||
            ((pcVar1[whitespace_state] == '*' || (pcVar1[whitespace_state] == '|')))))) ||
          (pcVar1[whitespace_state] == '&')) ||
         (((pcVar1[whitespace_state] == '^' || (pcVar1[whitespace_state] == '\'')) ||
          (pcVar1[whitespace_state] == '!')))) {
        pRes._4_4_ = 0;
      }
      else {
        if (pRes._4_4_ == 2) {
          pcVar1[local_18] = ' ';
          local_18 = local_18 + 1;
        }
        pRes._4_4_ = 1;
      }
      pcVar1[local_18] = pcVar1[whitespace_state];
      local_18 = local_18 + 1;
    }
  }
  pcVar1[local_18] = '\0';
  return pcVar1;
}

Assistant:

char * Mio_LibraryCleanStr( char * p )
{
    int i, k;
    int whitespace_state = 0;
    char * pRes = Abc_UtilStrsav( p );
    for ( i = k = 0; pRes[i]; i++ )
        if ( pRes[i] != ' ' && pRes[i] != '\t' && pRes[i] != '\r' && pRes[i] != '\n' ) 
        {
            if ( pRes[i] != '(' && pRes[i] != ')' && pRes[i] != '+' && pRes[i] != '*' && pRes[i] != '|' && pRes[i] != '&' && pRes[i] != '^' && pRes[i] != '\'' && pRes[i] != '!' ) 
            {
                if (whitespace_state == 2)
                    pRes[k++] = ' ';
                whitespace_state = 1;
            } 
            else
                whitespace_state = 0;
            pRes[k++] = pRes[i];
        } 
        else
            whitespace_state = whitespace_state ? 2 : 0;
    pRes[k] = 0;
    return pRes;
}